

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_containers_set.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  long lVar2;
  Color e;
  set<Color,_std::less<Color>_> color_set;
  value_type local_70;
  value_type local_6c [3];
  set<Color,_std::less<Color>_> local_60;
  pair<magic_enum::containers::detail::FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>,_bool>
  local_50;
  
  *(uint *)(__gxx_personality_v0 + *(long *)(std::cout + -0x18)) =
       *(uint *)(__gxx_personality_v0 + *(long *)(std::cout + -0x18)) | 1;
  local_6c[0] = RED;
  local_6c[1] = GREEN;
  local_6c[2] = 4;
  local_60.a.a._M_elems[0] = (container_type)(_Type)0x0;
  local_60.s = 0;
  lVar2 = 0;
  do {
    local_70 = *(value_type *)((long)local_6c + lVar2);
    magic_enum::containers::set<Color,_std::less<Color>_>::insert(&local_50,&local_60,&local_70);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xc);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_60.a.a._M_elems[0] = (container_type)(_Type)0x0;
  local_60.s = 0;
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_6c[0] = GREEN;
  magic_enum::containers::set<Color,_std::less<Color>_>::insert(&local_50,&local_60,local_6c);
  local_6c[0] = 4;
  magic_enum::containers::set<Color,_std::less<Color>_>::insert(&local_50,&local_60,local_6c);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {

  std::cout << std::boolalpha;
  magic_enum::containers::set color_set {Color::RED, Color::GREEN, Color::BLUE};
  std::cout << color_set.empty() << std::endl; // false
  std::cout << color_set.size() << std::endl; // 3

  color_set.clear();
  std::cout << color_set.empty() << std::endl; // true
  std::cout << color_set.size() << std::endl; // 0

  color_set.insert(Color::GREEN);
  color_set.insert(Color::BLUE);
  std::cout << color_set.empty() << std::endl; // false
  std::cout << color_set.size() << std::endl; // 2

  return 0;
}